

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O3

string * __thiscall
soul::makeUID_abi_cxx11_(string *__return_storage_ptr__,soul *this,EndpointDeclaration *e)

{
  long *plVar1;
  long *plVar2;
  string *extraout_RAX;
  string *psVar3;
  string_view name;
  IdentifierPath parentPath;
  undefined1 local_1e0 [32];
  long *local_1c0;
  soul *local_1b8;
  long local_1b0;
  long lStack_1a8;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_1a0;
  string local_148;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_128;
  IdentifierPath local_d0;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_78;
  
  plVar2 = *(long **)(this + 0x20);
  if (plVar2 == (long *)0x0) {
    plVar2 = *(long **)(this + 0x30);
    if (plVar2 == (long *)0x0) {
      throwInternalCompilerError("isValid()","toString",0x23);
    }
    local_1e0._0_8_ = local_1e0 + 0x10;
    std::__cxx11::string::_M_construct<char*>((string *)local_1e0,*plVar2,plVar2[1] + *plVar2);
  }
  else {
    local_78.items = (Identifier *)local_78.space;
    local_78.numActive = 0;
    local_78.numAllocated = 8;
    plVar1 = (long *)(**(code **)(*plVar2 + 0x40))(plVar2);
    if (plVar1 == (long *)0x0) {
      (**(code **)(*plVar2 + 0x10))(&local_1a0,plVar2);
      ArrayWithPreallocation<soul::Identifier,_8UL>::operator=(&local_78,&local_1a0);
      local_1a0.numActive = 0;
      if ((8 < local_1a0.numAllocated) && (local_1a0.items != (Identifier *)0x0)) {
        operator_delete__(local_1a0.items);
      }
    }
    else {
      plVar2 = (long *)(**(code **)(*plVar1 + 0x18))(plVar1);
      (**(code **)(*plVar2 + 0x10))(&local_d0,plVar2);
      IdentifierPath::IdentifierPath((IdentifierPath *)&local_1a0,&local_d0,(string *)plVar1[7]);
      ArrayWithPreallocation<soul::Identifier,_8UL>::operator=(&local_78,&local_1a0);
      local_1a0.numActive = 0;
      if (8 < local_1a0.numAllocated) {
        if (local_1a0.items != (Identifier *)0x0) {
          operator_delete__(local_1a0.items);
        }
        local_1a0.items = (Identifier *)local_1a0.space;
        local_1a0.numAllocated = 8;
      }
      local_d0.pathSections.numActive = 0;
      if (8 < local_d0.pathSections.numAllocated) {
        if (local_d0.pathSections.items != (Identifier *)0x0) {
          operator_delete__(local_d0.pathSections.items);
        }
        local_d0.pathSections.items = (Identifier *)local_d0.pathSections.space;
        local_d0.pathSections.numAllocated = 8;
      }
    }
    ArrayWithPreallocation<soul::Identifier,_8UL>::ArrayWithPreallocation(&local_128,&local_78);
    IdentifierPath::IdentifierPath
              ((IdentifierPath *)&local_1a0,(IdentifierPath *)&local_128,*(string **)(this + 0x30));
    IdentifierPath::toString_abi_cxx11_(&local_148,(IdentifierPath *)&local_1a0);
    Program::stripRootNamespaceFromQualifiedPath((string *)local_1e0,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    local_1a0.numActive = 0;
    if (8 < local_1a0.numAllocated) {
      if (local_1a0.items != (Identifier *)0x0) {
        operator_delete__(local_1a0.items);
      }
      local_1a0.items = (Identifier *)local_1a0.space;
      local_1a0.numAllocated = 8;
    }
    local_128.numActive = 0;
    if (8 < local_128.numAllocated) {
      if (local_128.items != (Identifier *)0x0) {
        operator_delete__(local_128.items);
      }
      local_128.items = (Identifier *)local_128.space;
      local_128.numAllocated = 8;
    }
    local_78.numActive = 0;
    if ((8 < local_78.numAllocated) && (local_78.items != (Identifier *)0x0)) {
      operator_delete__(local_78.items);
    }
  }
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1e0,0,(char *)0x0,0x27f92f);
  name._M_str = plVar2 + 2;
  if ((long *)*plVar2 == name._M_str) {
    local_1b0 = *name._M_str;
    lStack_1a8 = plVar2[3];
    local_1c0 = &local_1b0;
  }
  else {
    local_1b0 = *name._M_str;
    local_1c0 = (long *)*plVar2;
  }
  local_1b8 = (soul *)plVar2[1];
  *plVar2 = (long)name._M_str;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  name._M_len = (size_t)local_1c0;
  makeUID_abi_cxx11_(__return_storage_ptr__,local_1b8,name);
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  psVar3 = (string *)(local_1e0 + 0x10);
  if ((string *)local_1e0._0_8_ != psVar3) {
    operator_delete((void *)local_1e0._0_8_,local_1e0._16_8_ + 1);
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

static std::string makeUID (AST::EndpointDeclaration& e)    { return makeUID ("endpoint_" + getFullPathForASTObject (e)); }